

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O1

void __thiscall
Lodtalk::VMContext::executeScriptFromFile(VMContext *this,FILE *file,string *name,string *basePath)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  FILE *local_30;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_30 = file;
  local_58._M_unused._M_object = operator_new(0x18);
  *(FILE ***)local_58._M_unused._0_8_ = &local_30;
  *(string **)((long)local_58._M_unused._0_8_ + 8) = name;
  *(string **)((long)local_58._M_unused._0_8_ + 0x10) = basePath;
  pcStack_40 = std::
               _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:48:21)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:48:21)>
             ::_M_manager;
  withInterpreter(this,(WithInterpreterBlock *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void VMContext::executeScriptFromFile(FILE *file, const std::string &name, const std::string &basePath)
{
    withInterpreter([&](InterpreterProxy *interpreter) {
        Lodtalk::executeScriptFromFile(interpreter, file, name, basePath);
    });
}